

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O3

string_view helics::interfaceTypeName(InterfaceType type)

{
  undefined3 in_register_00000039;
  int iVar1;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  
  iVar1 = CONCAT31(in_register_00000039,type);
  if (iVar1 < 0x69) {
    if (iVar1 == 0x65) {
      sVar6._M_str = "Endpoint";
      sVar6._M_len = 8;
      return sVar6;
    }
    if (iVar1 == 0x66) {
      sVar3._M_str = "Filter";
      sVar3._M_len = 6;
      return sVar3;
    }
  }
  else {
    if (iVar1 == 0x69) {
      sVar4._M_str = "Input";
      sVar4._M_len = 5;
      return sVar4;
    }
    if (iVar1 == 0x70) {
      sVar5._M_str = "Publication";
      sVar5._M_len = 0xb;
      return sVar5;
    }
    if (iVar1 == 0x74) {
      sVar2._M_str = "Translator";
      sVar2._M_len = 10;
      return sVar2;
    }
  }
  sVar7._M_str = "Interface";
  sVar7._M_len = 9;
  return sVar7;
}

Assistant:

std::string_view interfaceTypeName(InterfaceType type) noexcept
{
    static constexpr std::string_view pubType{"Publication"};
    static constexpr std::string_view inpType{"Input"};
    static constexpr std::string_view endType{"Endpoint"};
    static constexpr std::string_view transType{"Translator"};
    static constexpr std::string_view filtType{"Filter"};
    static constexpr std::string_view otherType{"Interface"};

    switch (type) {
        case InterfaceType::PUBLICATION:
            return pubType;
        case InterfaceType::ENDPOINT:
            return endType;
        case InterfaceType::INPUT:
            return inpType;
        case InterfaceType::FILTER:
            return filtType;
        case InterfaceType::TRANSLATOR:
            return transType;
        default:
            return otherType;
    }
}